

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ace_get_monitor_data.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dc1b::Json2Array<aliyun::AceGetMonitorDataItemType>::Json2Array
          (Json2Array<aliyun::AceGetMonitorDataItemType> *this,Value *value,
          vector<aliyun::AceGetMonitorDataItemType,_std::allocator<aliyun::AceGetMonitorDataItemType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_38 [8];
  AceGetMonitorDataItemType val;
  int i;
  vector<aliyun::AceGetMonitorDataItemType,_std::allocator<aliyun::AceGetMonitorDataItemType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::AceGetMonitorDataItemType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val._12_4_ = 0; uVar1 = val._12_4_, AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val._12_4_ = val._12_4_ + 1) {
      value_00 = Json::Value::operator[](value,val._12_4_);
      Json2Type(value_00,(AceGetMonitorDataItemType *)local_38);
      std::
      vector<aliyun::AceGetMonitorDataItemType,_std::allocator<aliyun::AceGetMonitorDataItemType>_>
      ::push_back(vec,(value_type *)local_38);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }